

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O3

color __thiscall
optimization::graph_color::Conflict_Map::available_color
          (Conflict_Map *this,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *neighbors)

{
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  byte bVar1;
  int iVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar9;
  VarId var;
  allocator_type local_69;
  key_type local_68;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_68.super_Displayable._vptr_Displayable._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)this->color_num,(bool *)&local_68,&local_69);
  p_Var4 = (neighbors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(neighbors->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    do {
      local_68.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_68.id = *(uint32_t *)&p_Var4[1]._M_parent;
      pmVar3 = std::
               map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
               ::at((this->color_map).
                    super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,&local_68);
      iVar6 = *pmVar3;
      iVar2 = iVar6 + 0x3f;
      if (-1 < (long)iVar6) {
        iVar2 = iVar6;
      }
      bVar1 = (byte)iVar6 & 0x3f;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [(long)(iVar2 >> 6) + ((ulong)(((long)iVar6 & 0x800000000000003fU) < 0x8000000000000001) - 1)]
           = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar2 >> 6) +
              ((ulong)(((long)iVar6 & 0x800000000000003fU) < 0x8000000000000001) - 1)] &
             (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  if (this->color_num != 0) {
    uVar8 = 0;
    do {
      iVar6 = (int)uVar8;
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
        local_68.super_Displayable._vptr_Displayable._0_4_ = iVar6;
        this_00 = &((this->unused_colors).
                    super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_M_t;
        p_Var4 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent;
        if (p_Var4 == (_Base_ptr)0x0) goto LAB_00141767;
        p_Var7 = &(this_00->_M_impl).super__Rb_tree_header;
        p_Var5 = &p_Var7->_M_header;
        do {
          if (iVar6 <= (int)p_Var4[1]._M_color) {
            p_Var5 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar6];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var7) && ((int)p_Var5[1]._M_color <= iVar6)) {
          pVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::equal_range(this_00,(key_type *)&local_68);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_erase_aux(this_00,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
          iVar6 = (int)local_68.super_Displayable._vptr_Displayable;
        }
        if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
LAB_00141767:
          operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        return iVar6;
      }
      uVar8 = (ulong)(iVar6 + 1U);
    } while (this->color_num != iVar6 + 1U);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                ,0x117,
                "color optimization::graph_color::Conflict_Map::available_color(std::set<mir::inst::VarId> &)"
               );
}

Assistant:

color available_color(std::set<mir::inst::VarId>& neighbors) {
    std::vector<bool> colors(color_num, true);
    for (auto var : neighbors) {
      colors[color_map->at(var)] = false;
    }
    for (int i = 0; i < color_num; i++) {
      if (colors[i]) {
        if (unused_colors->count(i)) {
          unused_colors->erase(i);
        }
        return i;
      }
    }
    // errors
    assert(false);
    return 0;
  }